

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O1

bool deqp::gles3::Functional::verifyConstantDerivate
               (TestLog *log,ConstPixelBufferAccess *result,PixelBufferAccess *errorMask,
               DataType dataType,Vec4 *reference,Vec4 *threshold,Vec4 *scale,Vec4 *bias,
               VerificationLogging logPolicy)

{
  float fVar1;
  int i;
  DataType DVar2;
  long lVar3;
  uint uVar4;
  ConstPixelBufferAccess *pCVar6;
  int y;
  bool bVar7;
  float fVar8;
  BVec4 mask;
  Vector<bool,_4> res_8;
  Vec4 resDerivate;
  Vector<bool,_4> res_9;
  Vector<float,_4> res_7;
  int local_23c;
  undefined1 local_238 [24];
  Vector<float,_3> local_220;
  TestLog *local_210;
  TextureFormat local_208;
  undefined8 uStack_200;
  char local_1ec [4];
  ulong local_1e8 [3];
  ulong local_1d0;
  ConstPixelBufferAccess *local_1c8;
  PixelBufferAccess *local_1c0;
  undefined1 local_1b8 [8];
  undefined1 auStack_1b0 [384];
  ulong uVar5;
  
  local_210 = log;
  local_1c8 = result;
  local_1c0 = errorMask;
  DVar2 = glu::getDataTypeFloatScalars(dataType);
  switch(dataType) {
  case TYPE_FLOAT:
    local_1b8._0_4_ = 1;
    break;
  case TYPE_FLOAT_VEC2:
    local_1b8._0_4_ = 0x101;
    break;
  case TYPE_FLOAT_VEC3:
    local_1b8._0_4_ = 0x10101;
    break;
  default:
    local_1b8._0_4_ = 0x1010101;
  }
  local_238._20_4_ = 0;
  lVar3 = 0;
  do {
    local_238[lVar3 + 0x14] = auStack_1b0[lVar3 + -8] ^ 1;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  if (logPolicy == LOG_ALL) {
    local_1b8 = (undefined1  [8])local_210;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0,"Expecting ",10);
    if (DVar2 == TYPE_FLOAT_VEC3) {
      local_238._8_4_ = reference->m_data[2];
      local_238._0_4_ = reference->m_data[0];
      local_238._4_4_ = reference->m_data[1];
      tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_3> *)local_238);
    }
    else if (DVar2 == TYPE_FLOAT_VEC2) {
      local_238._0_4_ = reference->m_data[0];
      local_238._4_4_ = reference->m_data[1];
      tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_2> *)local_238);
    }
    else if (DVar2 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)reference->m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)auStack_1b0,reference);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)auStack_1b0," with threshold ",0x10);
    if (DVar2 == TYPE_FLOAT_VEC3) {
      local_238._8_4_ = threshold->m_data[2];
      local_238._0_4_ = threshold->m_data[0];
      local_238._4_4_ = threshold->m_data[1];
      tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_3> *)local_238);
    }
    else if (DVar2 == TYPE_FLOAT_VEC2) {
      local_238._0_4_ = threshold->m_data[0];
      local_238._4_4_ = threshold->m_data[1];
      tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_2> *)local_238);
    }
    else if (DVar2 == TYPE_FLOAT) {
      std::ostream::_M_insert<double>((double)threshold->m_data[0]);
    }
    else {
      tcu::operator<<((ostream *)auStack_1b0,threshold);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
    std::ios_base::~ios_base((ios_base *)(auStack_1b0 + 0x70));
  }
  if ((local_1c8->m_size).m_data[1] < 1) {
    local_23c = 0;
  }
  else {
    uVar4 = 0;
    local_23c = 0;
    pCVar6 = local_1c8;
    local_238._16_4_ = DVar2;
    do {
      uVar5 = (ulong)uVar4;
      if (0 < (pCVar6->m_size).m_data[0]) {
        y = 0;
        local_1d0 = uVar5;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_238,(int)pCVar6,y,(int)uVar5);
          local_1b8 = (undefined1  [8])0x0;
          auStack_1b0._0_8_ = (_func_int **)0x0;
          lVar3 = 0;
          do {
            *(float *)(auStack_1b0 + lVar3 * 4 + -8) =
                 *(float *)(local_238 + lVar3 * 4) - bias->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_208.order = R;
          local_208.type = SNORM_INT8;
          uStack_200 = 0;
          lVar3 = 0;
          do {
            (&local_208.order)[lVar3] =
                 (ChannelOrder)(*(float *)(auStack_1b0 + lVar3 * 4 + -8) / scale->m_data[lVar3]);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_238._0_4_ = R;
          local_238._4_4_ = SNORM_INT8;
          local_238._8_4_ = 0;
          local_238._12_4_ = 0;
          lVar3 = 0;
          do {
            *(float *)(local_238 + lVar3 * 4) =
                 reference->m_data[lVar3] - (float)(&local_208.order)[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_1b8 = (undefined1  [8])0x0;
          auStack_1b0._0_8_ = (_func_int **)0x0;
          lVar3 = 0;
          do {
            fVar1 = *(float *)(local_238 + lVar3 * 4);
            fVar8 = -fVar1;
            if (-fVar1 <= fVar1) {
              fVar8 = fVar1;
            }
            *(float *)(auStack_1b0 + lVar3 * 4 + -8) = fVar8;
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_220.m_data._0_8_ = local_220.m_data._0_8_ & 0xffffffff00000000;
          lVar3 = 0;
          do {
            *(bool *)((long)local_220.m_data + lVar3) =
                 *(float *)(auStack_1b0 + lVar3 * 4 + -8) <= threshold->m_data[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          local_1e8[0] = local_1e8[0] & 0xffffffff00000000;
          lVar3 = 0;
          do {
            *(byte *)((long)local_1e8 + lVar3) =
                 local_238[lVar3 + 0x14] | *(byte *)((long)local_220.m_data + lVar3);
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          builtin_strncpy(local_1ec,"\x01\x01\x01\x01",4);
          bVar7 = true;
          lVar3 = 0;
          do {
            if (bVar7) {
              bVar7 = *(char *)((long)local_1e8 + lVar3) == local_1ec[lVar3];
            }
            else {
              bVar7 = false;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          if (!bVar7) {
            if (local_23c < 10 && logPolicy == LOG_ALL) {
              local_1b8 = (undefined1  [8])local_210;
              std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_1b0,"FAIL: got ",10);
              if (local_238._16_4_ == TYPE_FLOAT_VEC3) {
                local_238._8_4_ = (int)uStack_200;
                local_238._0_4_ = local_208.order;
                local_238._4_4_ = local_208.type;
                tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_3> *)local_238);
              }
              else if (local_238._16_4_ == TYPE_FLOAT_VEC2) {
                local_238._0_4_ = local_208.order;
                local_238._4_4_ = local_208.type;
                tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_2> *)local_238);
              }
              else if (local_238._16_4_ == TYPE_FLOAT) {
                std::ostream::_M_insert<double>((double)(float)local_208.order);
              }
              else {
                tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_4> *)&local_208);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_1b0,", diff = ",9);
              local_1e8[0] = 0;
              local_1e8[1] = 0;
              lVar3 = 0;
              do {
                *(float *)((long)local_1e8 + lVar3 * 4) =
                     reference->m_data[lVar3] - (float)(&local_208.order)[lVar3];
                lVar3 = lVar3 + 1;
              } while (lVar3 != 4);
              local_238._0_4_ = R;
              local_238._4_4_ = SNORM_INT8;
              local_238._8_4_ = 0;
              local_238._12_4_ = 0;
              lVar3 = 0;
              do {
                fVar1 = *(float *)((long)local_1e8 + lVar3 * 4);
                fVar8 = -fVar1;
                if (-fVar1 <= fVar1) {
                  fVar8 = fVar1;
                }
                *(float *)(local_238 + lVar3 * 4) = fVar8;
                lVar3 = lVar3 + 1;
              } while (lVar3 != 4);
              if (local_238._16_4_ == TYPE_FLOAT_VEC3) {
                local_220.m_data[2] = (float)local_238._8_4_;
                local_220.m_data[0] = (float)local_238._0_4_;
                local_220.m_data[1] = (float)local_238._4_4_;
                tcu::operator<<((ostream *)auStack_1b0,&local_220);
              }
              else if (local_238._16_4_ == TYPE_FLOAT_VEC2) {
                local_220.m_data[0] = (float)local_238._0_4_;
                local_220.m_data[1] = (float)local_238._4_4_;
                tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_2> *)&local_220);
              }
              else if (local_238._16_4_ == TYPE_FLOAT) {
                std::ostream::_M_insert<double>((double)(float)local_238._0_4_);
              }
              else {
                tcu::operator<<((ostream *)auStack_1b0,(Vector<float,_4> *)local_238);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)auStack_1b0,", at x = ",9);
              std::ostream::operator<<((ostringstream *)auStack_1b0,y);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0,", y = ",6);
              std::ostream::operator<<((ostringstream *)auStack_1b0,(int)local_1d0);
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
              std::ios_base::~ios_base((ios_base *)(auStack_1b0 + 0x70));
              uVar5 = local_1d0;
            }
            local_23c = local_23c + 1;
            local_238._0_4_ = -1.7014636e+38;
            tcu::RGBA::toVec((RGBA *)local_1b8);
            tcu::PixelBufferAccess::setPixel(local_1c0,(Vec4 *)local_1b8,y,(int)uVar5,0);
          }
          uVar4 = (uint)uVar5;
          y = y + 1;
          pCVar6 = local_1c8;
        } while (y < (local_1c8->m_size).m_data[0]);
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 < (pCVar6->m_size).m_data[1]);
  }
  if (logPolicy == LOG_ALL && 9 < local_23c) {
    local_1b8 = (undefined1  [8])local_210;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0,"...",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
    std::ios_base::~ios_base((ios_base *)(auStack_1b0 + 0x70));
  }
  if (0 < local_23c && logPolicy == LOG_ALL) {
    local_1b8 = (undefined1  [8])local_210;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_1b0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0,"FAIL: found ",0xc);
    std::ostream::operator<<((ostringstream *)auStack_1b0,local_23c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_1b0," failed pixels",0xe);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_1b0);
    std::ios_base::~ios_base((ios_base *)(auStack_1b0 + 0x70));
  }
  return local_23c == 0;
}

Assistant:

static bool verifyConstantDerivate (tcu::TestLog&						log,
									const tcu::ConstPixelBufferAccess&	result,
									const tcu::PixelBufferAccess&		errorMask,
									glu::DataType						dataType,
									const tcu::Vec4&					reference,
									const tcu::Vec4&					threshold,
									const tcu::Vec4&					scale,
									const tcu::Vec4&					bias,
									VerificationLogging					logPolicy = LOG_ALL)
{
	const int			numComps		= glu::getDataTypeFloatScalars(dataType);
	const tcu::BVec4	mask			= tcu::logicalNot(getDerivateMask(dataType));
	int					numFailedPixels	= 0;

	if (logPolicy == LOG_ALL)
		log << TestLog::Message << "Expecting " << LogVecComps(reference, numComps) << " with threshold " << LogVecComps(threshold, numComps) << TestLog::EndMessage;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4		resDerivate		= readDerivate(result, scale, bias, x, y);
			const bool			isOk			= tcu::allEqual(tcu::logicalOr(tcu::lessThanEqual(tcu::abs(reference - resDerivate), threshold), mask), tcu::BVec4(true));

			if (!isOk)
			{
				if (numFailedPixels < MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
					log << TestLog::Message << "FAIL: got " << LogVecComps(resDerivate, numComps)
											<< ", diff = " << LogVecComps(tcu::abs(reference - resDerivate), numComps)
											<< ", at x = " << x << ", y = " << y
						<< TestLog::EndMessage;
				numFailedPixels += 1;
				errorMask.setPixel(tcu::RGBA::red().toVec(), x, y);
			}
		}
	}

	if (numFailedPixels >= MAX_FAILED_MESSAGES && logPolicy == LOG_ALL)
		log << TestLog::Message << "..." << TestLog::EndMessage;

	if (numFailedPixels > 0 && logPolicy == LOG_ALL)
		log << TestLog::Message << "FAIL: found " << numFailedPixels << " failed pixels" << TestLog::EndMessage;

	return numFailedPixels == 0;
}